

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

int __thiscall
cs_impl::any::
holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::kill(holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,__pid_t __pid,int __sig)

{
  int extraout_EAX;
  
  cs::
  allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_64UL,_cs_impl::default_allocator_provider>
  ::free((allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *)holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator,this);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}